

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_dup_to_ctx(lyd_node *node,int recursive,ly_ctx *ctx)

{
  lyd_node **pplVar1;
  LYS_NODE LVar2;
  undefined4 uVar3;
  lyd_node *plVar4;
  int iVar5;
  dict_rec *pdVar6;
  ly_ctx *leaf;
  lys_node *plVar7;
  LY_ERR *pLVar8;
  undefined8 uVar9;
  lyd_node *plVar10;
  ly_ctx *node_00;
  ly_ctx *ctx_00;
  ly_ctx *plVar11;
  ly_ctx *parent;
  ly_ctx *ctx_01;
  dict_rec *value_;
  
  if (node == (lyd_node *)0x0) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
    return (lyd_node *)0x0;
  }
  ctx_01 = ctx;
  if (node->schema->module->ctx == ctx) {
    ctx_01 = (ly_ctx *)0x0;
  }
  node_00 = (ly_ctx *)0x0;
  plVar4 = node;
  leaf = (ly_ctx *)0x0;
  do {
    parent = leaf;
    plVar10 = plVar4;
    plVar7 = plVar10->schema;
    LVar2 = plVar7->nodetype;
    plVar11 = ctx;
    if (0x1f < (int)LVar2) {
      if (0xff < (int)LVar2) {
        if ((LVar2 == LYS_RPC) || (LVar2 == LYS_ACTION)) goto LAB_0015d511;
        if (LVar2 != LYS_ANYDATA) goto LAB_0015d851;
LAB_0015d5e3:
        leaf = (ly_ctx *)calloc(1,0x40);
        if (leaf == (ly_ctx *)0x0) goto LAB_0015d7d2;
        iVar5 = lyd_dup_common((lyd_node *)parent,(lyd_node *)leaf,plVar10,ctx_01);
        if (iVar5 != 0) goto LAB_0015d81d;
        uVar3 = *(undefined4 *)&plVar10->child;
        *(undefined4 *)&(leaf->dict).recs[2].next = uVar3;
        plVar7 = plVar10[1].schema;
        if (plVar7 == (lys_node *)0x0) goto switchD_0015d649_caseD_6;
        switch(uVar3) {
        case 0:
        case 2:
        case 4:
          if (ctx_01 == (ly_ctx *)0x0) {
            plVar11 = plVar10->schema->module->ctx;
          }
          goto LAB_0015d68d;
        case 1:
        case 3:
        case 5:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,0x1217,
                        "struct lyd_node *lyd_dup_to_ctx(const struct lyd_node *, int, struct ly_ctx *)"
                       );
        default:
          goto switchD_0015d649_caseD_6;
        case 8:
          if (ctx_01 == (ly_ctx *)0x0) {
            plVar11 = plVar10->schema->module->ctx;
          }
          plVar7 = (lys_node *)lyxml_dup_elem(plVar11,(lyxml_elem *)plVar7,(lyxml_elem *)0x0,1);
          break;
        case 0x10:
          plVar7 = (lys_node *)lyd_dup_to_ctx((lyd_node *)plVar7,1,ctx_01);
        }
        goto LAB_0015d702;
      }
      if (LVar2 == LYS_ANYXML) goto LAB_0015d5e3;
      if (LVar2 != LYS_NOTIF) goto LAB_0015d851;
LAB_0015d511:
      leaf = (ly_ctx *)calloc(1,0x38);
      if (leaf == (ly_ctx *)0x0) goto LAB_0015d7d2;
      (leaf->dict).recs[2].next = (dict_rec *)0x0;
      iVar5 = lyd_dup_common((lyd_node *)parent,(lyd_node *)leaf,plVar10,ctx_01);
      if (iVar5 != 0) {
LAB_0015d81d:
        if ((lys_node *)(leaf->dict).recs[0].next != (lys_node *)0x0) goto LAB_0015d823;
        goto LAB_0015d82d;
      }
      goto switchD_0015d649_caseD_6;
    }
    if (7 < (int)LVar2) {
      if (LVar2 == LYS_LEAFLIST) goto LAB_0015d553;
      if (LVar2 == LYS_LIST) goto LAB_0015d511;
LAB_0015d851:
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EINT;
      uVar9 = 0x122c;
LAB_0015d7c9:
      leaf = (ly_ctx *)0x0;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
             ,uVar9);
LAB_0015d82d:
      free(leaf);
LAB_0015d835:
      lyd_free((lyd_node *)node_00);
      return (lyd_node *)0x0;
    }
    if (LVar2 == LYS_CONTAINER) goto LAB_0015d511;
    if (LVar2 != LYS_LEAF) goto LAB_0015d851;
LAB_0015d553:
    leaf = (ly_ctx *)calloc(1,0x48);
    if (leaf == (ly_ctx *)0x0) {
LAB_0015d7d2:
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      leaf = (ly_ctx *)0x0;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_dup_to_ctx");
      goto LAB_0015d82d;
    }
    ctx_00 = ctx;
    if (ctx_01 == (ly_ctx *)0x0) {
      ctx_00 = plVar7->module->ctx;
    }
    pdVar6 = (dict_rec *)lydict_insert(ctx_00,(char *)plVar10->child,0);
    value_ = (leaf->dict).recs + 2;
    (leaf->dict).recs[2].next = pdVar6;
    *(uint16_t *)&(leaf->dict).recs[2].field_0x10 = *(uint16_t *)&plVar10[1].validity;
    iVar5 = lyd_dup_common((lyd_node *)parent,(lyd_node *)leaf,plVar10,ctx_01);
    if (iVar5 != 0) {
      if ((lys_node *)(leaf->dict).recs[0].next == (lys_node *)0x0) {
        if (ctx_01 == (ly_ctx *)0x0) {
          ctx = plVar10->schema->module->ctx;
        }
        lydict_remove(ctx,(char *)value_->next);
        goto LAB_0015d81d;
      }
LAB_0015d823:
      lyd_free((lyd_node *)leaf);
      goto LAB_0015d835;
    }
    switch(*(uint16_t *)&(leaf->dict).recs[2].field_0x10) {
    case 1:
    case 10:
      plVar7 = (lys_node *)(leaf->dict).recs[2].next;
      break;
    case 2:
    case 7:
      goto switchD_0015d5d8_caseD_2;
    default:
switchD_0015d5d8_caseD_3:
      plVar7 = plVar10[1].schema;
      break;
    case 6:
      if (ctx_01 == (ly_ctx *)0x0) goto switchD_0015d5d8_caseD_3;
      goto switchD_0015d5d8_caseD_2;
    case 8:
    case 9:
      ((lyd_val *)&(leaf->dict).recs[2].value)->binary = (char *)0x0;
      goto switchD_0015d649_caseD_6;
    case 0xb:
      if (ctx_01 == (ly_ctx *)0x0) {
        plVar11 = node->schema->module->ctx;
      }
      plVar7 = plVar10[1].schema;
LAB_0015d68d:
      plVar7 = (lys_node *)lydict_insert(plVar11,(char *)plVar7,0);
    }
LAB_0015d702:
    (leaf->dict).recs[2].value = (char *)plVar7;
switchD_0015d649_caseD_6:
    if (node_00 == (ly_ctx *)0x0) {
      node_00 = leaf;
    }
    if (recursive == 0) {
      return (lyd_node *)node_00;
    }
    plVar4 = plVar10->child;
    if (plVar10->child == (lyd_node *)0x0 ||
        (plVar10->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
      if (plVar10->parent == node->parent) {
        return (lyd_node *)node_00;
      }
      plVar4 = plVar10->next;
      leaf = parent;
      if (plVar10->next == (lyd_node *)0x0) {
        plVar10 = plVar10->parent;
        do {
          if (plVar10->parent == node->parent) {
            return (lyd_node *)node_00;
          }
          if (parent == (ly_ctx *)0x0) {
            pLVar8 = ly_errno_location();
            *pLVar8 = LY_EINT;
            uVar9 = 0x1250;
            goto LAB_0015d7c9;
          }
          parent = *(ly_ctx **)&(parent->dict).recs[1].field_0x10;
          pplVar1 = &plVar10->next;
          plVar4 = *pplVar1;
          plVar10 = plVar10->parent;
          leaf = parent;
        } while (*pplVar1 == (lyd_node *)0x0);
      }
    }
  } while( true );
switchD_0015d5d8_caseD_2:
  lyp_parse_value((lys_type *)&((lys_node *)(leaf->dict).recs[0].next)[1].ref,(char **)value_,
                  (lyxml_elem *)0x0,(lyd_node_leaf_list *)leaf,(lyd_attr *)0x0,1,
                  (byte)node->field_0x9 & 1);
  goto switchD_0015d649_caseD_6;
}

Assistant:

lyd_node *
lyd_dup_to_ctx(const struct lyd_node *node, int recursive, struct ly_ctx *ctx)
{
    const struct lyd_node *next, *elem;
    struct lyd_node *ret, *parent, *new_node = NULL;
    struct lyd_node_leaf_list *new_leaf;
    struct lyd_node_anydata *new_any, *old_any;

    if (!node) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (ctx == node->schema->module->ctx) {
        /* target context is actually the same as the source context,
         * ignore the target context */
        ctx = NULL;
    }

    ret = NULL;
    parent = NULL;

    /* LY_TREE_DFS */
    for (elem = next = node; elem; elem = next) {

        /* fill specific part */
        switch (elem->schema->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            new_leaf = calloc(1, sizeof *new_leaf);
            new_node = (struct lyd_node *)new_leaf;
            if (!new_node) {
                LOGMEM;
                goto error;
            }

            new_leaf->value_str = lydict_insert(ctx ? ctx : elem->schema->module->ctx,
                                                ((struct lyd_node_leaf_list *)elem)->value_str, 0);
            new_leaf->value_type = ((struct lyd_node_leaf_list *)elem)->value_type;
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                if (!new_node->schema) {
                    /* in error cleanup, just free will be called instead of lyd_free(),
                     * so do the additional cleanup here */
                    lydict_remove(ctx ? ctx : elem->schema->module->ctx, new_leaf->value_str);
                }
                goto error;
            }

            switch (new_leaf->value_type) {
            case LY_TYPE_BINARY:
            case LY_TYPE_STRING:
                /* value_str pointer is shared in these cases */
                new_leaf->value.string = new_leaf->value_str;
                break;
            case LY_TYPE_LEAFREF:
                new_leaf->value.leafref = NULL;
                break;
            case LY_TYPE_INST:
                new_leaf->value.instance = NULL;
                break;
            case LY_TYPE_UNION:
                /* unresolved union (this must be non-validated tree), duplicate the stored string (duplicated
                 * because of possible change of the value in case of instance-identifier) */
                new_leaf->value.string = lydict_insert(ctx ? ctx : node->schema->module->ctx,
                                                       ((struct lyd_node_leaf_list *)elem)->value.string, 0);
                break;
            case LY_TYPE_ENUM:
                if (!ctx) {
                    /* we are still in the same context - just copy the data */
                    new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                    break;
                }
                /* no break */
            case LY_TYPE_IDENT:
            case LY_TYPE_BITS:
                /* in case of duplicating bits (no matter if in the same context or not) or enum and identityref into
                 * a different context, searching for the type and duplicating the data is almost as same as resolving
                 * the string value, so due to a simplicity, parse the value for the duplicated leaf */
                lyp_parse_value(&((struct lys_node_leaf *)new_leaf->schema)->type, &new_leaf->value_str, NULL,
                                new_leaf, NULL, 1, node->dflt);
                break;
            default:
                new_leaf->value = ((struct lyd_node_leaf_list *)elem)->value;
                break;
            }
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            old_any = (struct lyd_node_anydata *)elem;
            new_any = calloc(1, sizeof *new_any);
            new_node = (struct lyd_node *)new_any;
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }

            new_any->value_type = old_any->value_type;
            if (!(void*)old_any->value.tree) {
                /* no value to duplicate */
                break;
            }
            /* duplicate the value */
            switch (old_any->value_type) {
            case LYD_ANYDATA_CONSTSTRING:
            case LYD_ANYDATA_SXML:
            case LYD_ANYDATA_JSON:
                new_any->value.str = lydict_insert(ctx ? ctx : elem->schema->module->ctx, old_any->value.str, 0);
                break;
            case LYD_ANYDATA_DATATREE:
                new_any->value.tree = lyd_dup_to_ctx(old_any->value.tree, 1, ctx);
                break;
            case LYD_ANYDATA_XML:
                new_any->value.xml = lyxml_dup_elem(ctx ? ctx : elem->schema->module->ctx, old_any->value.xml, NULL, 1);
                break;
            case LYD_ANYDATA_STRING:
            case LYD_ANYDATA_SXMLD:
            case LYD_ANYDATA_JSOND:
                /* dynamic strings are used only as input parameters */
                assert(0);
                break;
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            new_node = calloc(1, sizeof *new_node);
            if (!new_node) {
                LOGMEM;
                goto error;
            }
            new_node->child = NULL;

            if (lyd_dup_common(parent, new_node, elem, ctx)) {
                goto error;
            }
            break;
        default:
            LOGINT;
            goto error;
        }
        if (!ret) {
            ret = new_node;
        }

        if (!recursive) {
            break;
        }

        /* LY_TREE_DFS_END */
        /* select element for the next run - children first */
        next = elem->child;
        /* child exception for lyd_node_leaf and lyd_node_leaflist */
        if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next = NULL;
        }
        if (!next) {
            if (elem->parent == node->parent) {
                break;
            }
            /* no children, so try siblings */
            next = elem->next;
        } else {
            parent = new_node;
        }
        new_node = NULL;

        while (!next) {
            /* no siblings, go back through parents */
            elem = elem->parent;
            if (elem->parent == node->parent) {
                break;
            }
            if (!parent) {
                LOGINT;
                goto error;
            }
            parent = parent->parent;
            /* parent is already processed, go to its sibling */
            next = elem->next;
        }
    }

    return ret;

error:
    if (new_node && new_node->schema) {
        lyd_free(new_node);
    } else {
        free(new_node);
    }
    lyd_free(ret);
    return NULL;
}